

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

void quat_get_axes(quat q,vec3 *x,vec3 *y,vec3 *z)

{
  mat4 m;
  mat4 local_60;
  
  mat4_from_quat(&local_60,q);
  x->x = local_60.m[0];
  y->x = local_60.m[1];
  z->x = local_60.m[2];
  x->y = local_60.m[4];
  y->y = local_60.m[5];
  z->y = local_60.m[6];
  x->z = local_60.m[8];
  y->z = local_60.m[9];
  z->z = local_60.m[10];
  return;
}

Assistant:

void quat_get_axes(quat q, vec3 *x, vec3 *y, vec3 *z) {
    mat4 m = mat4_from_quat(q);

    x->x = m.m[0];
    y->x = m.m[1];
    z->x = m.m[2];

    x->y = m.m[4];
    y->y = m.m[5];
    z->y = m.m[6];

    x->z = m.m[8];
    y->z = m.m[9];
    z->z = m.m[10];
}